

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O3

void __thiscall Boss::Boss(Boss *this,Person *person,Address *address,Employee *employee,Boss *boss)

{
  pointer pcVar1;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_90._0_8_ = local_90 + 0x10;
  pcVar1 = (address->country)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + (address->country)._M_string_length);
  pcVar1 = (address->city)._M_dataplus._M_p;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (address->city)._M_string_length);
  pcVar1 = (address->street)._M_dataplus._M_p;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (address->street)._M_string_length);
  Employee::Employee(&this->super_Employee,person,(Address *)local_90,employee);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  (this->super_Employee).super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a60;
  this->numberOfEmployee = boss->numberOfEmployee;
  return;
}

Assistant:

Boss::Boss(const Person &person, Address address, const Employee &employee, const Boss &boss) : Employee(person, address, employee) {

    this->numberOfEmployee = boss.numberOfEmployee;
}